

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

int MeCab::decode_charset(char *charset)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  string tmp;
  allocator local_29;
  undefined1 *local_28;
  ulong local_20;
  undefined1 local_18 [16];
  
  std::__cxx11::string::string((string *)&local_28,charset,&local_29);
  if (local_20 != 0) {
    uVar3 = 0;
    do {
      if ((byte)(local_28[uVar3] + 0xbf) < 0x1a) {
        local_28[uVar3] = local_28[uVar3] | 0x20;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_20);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_28);
  iVar2 = 1;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_28);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_28);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_28);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)&local_28);
          iVar2 = 0;
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)&local_28);
            iVar2 = 0;
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)&local_28);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)&local_28);
                iVar2 = 2;
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)&local_28);
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)&local_28);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)&local_28);
                      iVar2 = 3;
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)&local_28);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)&local_28);
                          if (iVar1 != 0) {
                            iVar1 = std::__cxx11::string::compare((char *)&local_28);
                            iVar2 = 5;
                            if (iVar1 != 0) {
                              iVar1 = std::__cxx11::string::compare((char *)&local_28);
                              if (iVar1 != 0) {
                                iVar1 = std::__cxx11::string::compare((char *)&local_28);
                                if (iVar1 != 0) {
                                  iVar1 = std::__cxx11::string::compare((char *)&local_28);
                                  iVar2 = 4;
                                  if (iVar1 != 0) {
                                    iVar1 = std::__cxx11::string::compare((char *)&local_28);
                                    if (iVar1 != 0) {
                                      iVar1 = std::__cxx11::string::compare((char *)&local_28);
                                      if (iVar1 != 0) {
                                        iVar2 = std::__cxx11::string::compare((char *)&local_28);
                                        iVar2 = (uint)(iVar2 == 0) * 4 + 2;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_28 != local_18) {
    operator_delete(local_28);
  }
  return iVar2;
}

Assistant:

int decode_charset(const char *charset) {
  std::string tmp = charset;
  toLower(&tmp);
  if (tmp == "sjis"  || tmp == "shift-jis" ||
      tmp == "shift_jis" || tmp == "cp932")
    return CP932;
  else if (tmp == "euc"   || tmp == "euc_jp" ||
           tmp == "euc-jp")
    return EUC_JP;
  else if (tmp == "utf8" || tmp == "utf_8" ||
           tmp == "utf-8")
    return UTF8;
  else if (tmp == "utf16" || tmp == "utf_16" ||
           tmp == "utf-16")
    return UTF16;
  else if (tmp == "utf16be" || tmp == "utf_16be" ||
           tmp == "utf-16be")
    return UTF16BE;
  else if (tmp == "utf16le" || tmp == "utf_16le" ||
           tmp == "utf-16le")
    return UTF16LE;
  else if (tmp == "ascii")
    return ASCII;

  return UTF8;  // default is UTF8
}